

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_perftest.cc
# Opt level: O3

int main(void)

{
  uint uVar1;
  int64_t iVar2;
  int64_t iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  float fVar12;
  int delta;
  vector<int,_std::allocator<int>_> times;
  string err;
  uint64_t slash_bits;
  size_t len;
  char buf [200];
  int local_14c;
  uint *local_148;
  iterator iStack_140;
  int *local_138;
  ulong local_130;
  string local_128;
  uint64_t local_108;
  size_t local_100;
  char local_f8 [72];
  undefined4 local_b0;
  undefined3 uStack_ac;
  
  local_148 = (uint *)0x0;
  iStack_140._M_current = (int *)0x0;
  uVar6 = 0;
  local_138 = (int *)0x0;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_100 = 0x4e;
  pcVar9 = "../../third_party/WebKit/Source/WebCore/platform/leveldb/LevelDBWriteBatch.cpp";
  pcVar10 = local_f8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)pcVar10 = *(undefined8 *)pcVar9;
    pcVar9 = pcVar9 + 8;
    pcVar10 = pcVar10 + 8;
  }
  local_b0 = 0x632e6863;
  uStack_ac = 0x7070;
  do {
    local_130 = uVar6;
    iVar2 = GetTimeMillis();
    iVar8 = 2000000;
    do {
      CanonicalizePath(local_f8,&local_100,&local_108,&local_128);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    iVar3 = GetTimeMillis();
    local_14c = (int)iVar3 - (int)iVar2;
    if (iStack_140._M_current == local_138) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_148,iStack_140,&local_14c);
      iVar8 = (int)local_130;
    }
    else {
      *iStack_140._M_current = local_14c;
      iStack_140._M_current = iStack_140._M_current + 1;
      iVar8 = (int)local_130;
    }
    uVar6 = (ulong)(iVar8 + 1U);
  } while (iVar8 + 1U != 5);
  uVar4 = (long)iStack_140._M_current - (long)local_148 >> 2;
  uVar7 = (ulong)*local_148;
  uVar6 = uVar7;
  if ((uint *)iStack_140._M_current == local_148) {
    fVar12 = 0.0;
  }
  else {
    fVar12 = 0.0;
    lVar5 = 0;
    uVar11 = uVar7;
    do {
      uVar1 = local_148[lVar5];
      uVar7 = uVar11;
      if ((int)uVar11 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      if ((int)uVar1 < (int)uVar6) {
        uVar6 = (ulong)uVar1;
        uVar7 = uVar11;
      }
      fVar12 = fVar12 + (float)(int)uVar1;
      lVar5 = lVar5 + 1;
      uVar11 = uVar7;
    } while (uVar4 + (uVar4 == 0) != lVar5);
  }
  printf("min %dms  max %dms  avg %.1fms\n",SUB84((double)(fVar12 / (float)uVar4),0),uVar6,uVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if (local_148 != (uint *)0x0) {
    operator_delete(local_148,(long)local_138 - (long)local_148);
  }
  return 0;
}

Assistant:

int main() {
  vector<int> times;
  string err;

  char buf[200];
  size_t len = strlen(kPath);
  strcpy(buf, kPath);

  for (int j = 0; j < 5; ++j) {
    const int kNumRepetitions = 2000000;
    int64_t start = GetTimeMillis();
    uint64_t slash_bits;
    for (int i = 0; i < kNumRepetitions; ++i) {
      CanonicalizePath(buf, &len, &slash_bits, &err);
    }
    int delta = (int)(GetTimeMillis() - start);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());
}